

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

PropertySymOpnd * __thiscall IR::PropertySymOpnd::CopyCommon(PropertySymOpnd *this,Func *func)

{
  PropertySym *propertySym;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertySymOpnd *pPVar4;
  
  propertySym = (PropertySym *)(this->super_SymOpnd).m_sym;
  if ((propertySym->super_Sym).m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar4 = New(propertySym,(this->super_SymOpnd).super_Opnd.m_type,func);
  (pPVar4->super_SymOpnd).super_Opnd.m_valueType.field_0 =
       (this->super_SymOpnd).super_Opnd.m_valueType.field_0;
  pPVar4->m_inlineCacheIndex = this->m_inlineCacheIndex;
  pPVar4->m_runtimeInlineCache = this->m_runtimeInlineCache;
  pPVar4->m_runtimePolymorphicInlineCache = this->m_runtimePolymorphicInlineCache;
  (pPVar4->super_SymOpnd).super_Opnd.field_0xb =
       (pPVar4->super_SymOpnd).super_Opnd.field_0xb & 0xef |
       (this->super_SymOpnd).super_Opnd.field_0xb & 0x10;
  return pPVar4;
}

Assistant:

PropertySymOpnd *
PropertySymOpnd::CopyCommon(Func *func)
{
    PropertySymOpnd *newOpnd = PropertySymOpnd::New(this->m_sym->AsPropertySym(), this->m_type, func);
    newOpnd->m_valueType = this->m_valueType;
    newOpnd->m_inlineCacheIndex = this->m_inlineCacheIndex;
    newOpnd->m_runtimeInlineCache = this->m_runtimeInlineCache;
    newOpnd->m_runtimePolymorphicInlineCache = this->m_runtimePolymorphicInlineCache;
    newOpnd->canStoreTemp = this->canStoreTemp;
    return newOpnd;
}